

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::BaseBuilder::newAlignNode
          (BaseBuilder *this,AlignNode **out,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignNode *pAVar2;
  AlignNode **unaff_RBX;
  BaseBuilder *unaff_R15;
  size_t sStack_28;
  
  *out = (AlignNode *)0x0;
  if ((this->_allocator)._zone == (Zone *)0x0) {
    newAlignNode();
  }
  else {
    pAVar2 = (AlignNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    unaff_RBX = out;
    unaff_R15 = this;
    if (pAVar2 != (AlignNode *)0x0) {
      (pAVar2->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
      (pAVar2->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
      (pAVar2->super_BaseNode).field_1._any._nodeType = kAlign;
      (pAVar2->super_BaseNode).field_1._any._nodeFlags = this->_nodeFlags | (kHasNoEffect|kIsCode);
      *(undefined8 *)((long)&(pAVar2->super_BaseNode).field_1 + 2) = 0;
      *(undefined8 *)((long)&(pAVar2->super_BaseNode).field_3 + 2) = 0;
      (pAVar2->super_BaseNode)._passData = (void *)0x0;
      (pAVar2->super_BaseNode)._inlineComment = (char *)0x0;
      (pAVar2->super_BaseNode).field_1._alignData._alignMode = alignMode;
      pAVar2->_alignment = alignment;
      *out = pAVar2;
      return 0;
    }
  }
  *unaff_RBX = (AlignNode *)0x0;
  EVar1 = BaseEmitter::reportError(&unaff_R15->super_BaseEmitter,1,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseBuilder::newAlignNode(AlignNode** out, AlignMode alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}